

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O0

mz_bool mz_zip_array_ensure_capacity
                  (mz_zip_archive *pZip,mz_zip_array *pArray,size_t min_new_capacity,mz_uint growing
                  )

{
  void *pvVar1;
  size_t local_48;
  size_t local_40;
  size_t new_capacity;
  void *pNew_p;
  mz_uint growing_local;
  size_t min_new_capacity_local;
  mz_zip_array *pArray_local;
  mz_zip_archive *pZip_local;
  
  if (pArray->m_element_size == 0) {
    __assert_fail("pArray->m_element_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/luazip/miniz.c"
                  ,0xbb6,
                  "mz_bool mz_zip_array_ensure_capacity(mz_zip_archive *, mz_zip_array *, size_t, mz_uint)"
                 );
  }
  if (pArray->m_capacity < min_new_capacity) {
    local_40 = min_new_capacity;
    if (growing != 0) {
      if (pArray->m_capacity == 0) {
        local_48 = 1;
      }
      else {
        local_48 = pArray->m_capacity;
      }
      for (local_40 = local_48; local_40 < min_new_capacity; local_40 = local_40 << 1) {
      }
    }
    pvVar1 = (*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,pArray->m_p,(size_t)pArray->m_element_size,
                                 local_40);
    if (pvVar1 == (void *)0x0) {
      pZip_local._4_4_ = 0;
    }
    else {
      pArray->m_p = pvVar1;
      pArray->m_capacity = local_40;
      pZip_local._4_4_ = 1;
    }
  }
  else {
    pZip_local._4_4_ = 1;
  }
  return pZip_local._4_4_;
}

Assistant:

static mz_bool mz_zip_array_ensure_capacity(mz_zip_archive *pZip, mz_zip_array *pArray, size_t min_new_capacity, mz_uint growing)
{
    void *pNew_p;
    size_t new_capacity = min_new_capacity;
    MZ_ASSERT(pArray->m_element_size);
    if (pArray->m_capacity >= min_new_capacity)
        return MZ_TRUE;
    if (growing)
    {
        new_capacity = MZ_MAX(1, pArray->m_capacity);
        while (new_capacity < min_new_capacity)
            new_capacity *= 2;
    }
    if (NULL == (pNew_p = pZip->m_pRealloc(pZip->m_pAlloc_opaque, pArray->m_p, pArray->m_element_size, new_capacity)))
        return MZ_FALSE;
    pArray->m_p = pNew_p;
    pArray->m_capacity = new_capacity;
    return MZ_TRUE;
}